

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O2

void lj_gc_freeall(global_State *g)

{
  uint uVar1;
  uint uVar2;
  
  (g->gc).currentwhite = 'C';
  gc_sweep(g,&(g->gc).root,0xffffffff);
  uVar1 = (g->str).mask;
  for (uVar2 = 0; uVar2 <= uVar1; uVar2 = uVar2 + 1) {
    gc_sweepstr(g,(g->str).tab + uVar2);
  }
  return;
}

Assistant:

void lj_gc_freeall(global_State *g)
{
  MSize i, strmask;
  /* Free everything, except super-fixed objects (the main thread). */
  g->gc.currentwhite = LJ_GC_WHITES | LJ_GC_SFIXED;
  gc_fullsweep(g, &g->gc.root);
  strmask = g->str.mask;
  for (i = 0; i <= strmask; i++)  /* Free all string hash chains. */
    gc_sweepstr(g, &g->str.tab[i]);
}